

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<Js::SerializedFieldList>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,
          SerializedFieldList *value)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  BufferBuilder *pBVar2;
  ImmutableList<Js::BufferBuilder_*> *pIVar3;
  
  pBVar2 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x20,this->alloc,0x366bee);
  pBVar2->clue = clue;
  pBVar2->offset = 0xffffffff;
  pBVar2->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014f3678;
  *(SerializedFieldList *)&pBVar2->field_0x14 = *value;
  pBVar2->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014f3658;
  pIVar1 = builder->list;
  pIVar3 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
  pIVar3->value = pBVar2;
  pIVar3->next = pIVar1;
  builder->list = pIVar3;
  return 8;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }